

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O2

int Ivy_ManRewritePre(Ivy_Man_t *p,int fUpdateLevel,int fUseZeroCost,int fVerbose)

{
  char cVar1;
  char *pcVar2;
  Vec_Ptr_t *p_00;
  int *piVar3;
  Vec_Int_t *__ptr;
  bool bVar4;
  bool bVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  Rwt_Man_t *p_01;
  Ivy_Obj_t *pNode;
  abctime aVar11;
  Ivy_Store_t *pIVar12;
  abctime aVar13;
  Ivy_Obj_t *pIVar15;
  abctime aVar16;
  ulong uVar17;
  void *pvVar18;
  Ivy_Obj_t *pIVar19;
  Ivy_Obj_t *pIVar20;
  Dec_Graph_t *pGraph;
  ulong uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  Ivy_Obj_t *pIVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int i;
  Ivy_Obj_t *pIVar30;
  Vec_Ptr_t *pVVar31;
  long lVar32;
  int *piVar33;
  int *piVar34;
  Ivy_Obj_t *pIVar35;
  long lVar36;
  int *piVar37;
  long lVar38;
  int local_108;
  int local_f8;
  int local_f4;
  uint local_d8;
  int local_cc;
  int *local_90;
  long lVar14;
  
  aVar10 = Abc_Clock();
  iVar9 = 0;
  p_01 = Rwt_ManStart(0);
  p->pData = p_01;
  if (p_01 != (Rwt_Man_t *)0x0) {
    if (fUpdateLevel != 0) {
      if (p->fFanout == 0) {
        Ivy_ManStartFanout(p);
      }
      Ivy_ManRequiredLevels(p);
    }
    pVVar31 = p->vObjs;
    iVar9 = pVVar31->nSize;
    iVar23 = iVar9;
    for (i = 0; i < iVar23; i = i + 1) {
      pNode = (Ivy_Obj_t *)Vec_PtrEntry(pVVar31,i);
      if (((pNode != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x8 & 0xf) - 7)) &&
         (Ivy_NodeFixBufferFanins(p,pNode,1), (*(uint *)&pNode->field_0x8 & 0xf) != 7)) {
        if (iVar9 <= i) break;
        p_01->nNodesConsidered = p_01->nNodesConsidered + 1;
        if (fUpdateLevel == 0) {
          local_cc = 1000000;
        }
        else {
          local_cc = Vec_IntEntry(p->vRequired,pNode->Id);
        }
        aVar11 = Abc_Clock();
        pIVar12 = Ivy_NodeFindCutsAll(p,pNode,5);
        aVar13 = Abc_Clock();
        p_01->timeCut = p_01->timeCut + (aVar13 - aVar11);
        aVar11 = Abc_Clock();
        local_90 = pIVar12->pCuts[1].pArray;
        local_d8 = 0;
        local_108 = -1;
        local_f8 = local_108;
        for (lVar22 = 1; lVar22 < pIVar12->nCuts; lVar22 = lVar22 + 1) {
          if (pIVar12->pCuts[lVar22].nSize == 4) {
            piVar37 = pIVar12->pCuts[lVar22].pArray;
            sVar6 = 4;
            for (lVar38 = 0; lVar14 = (long)sVar6, lVar38 < lVar14; lVar38 = lVar38 + 1) {
              pIVar15 = Ivy_ManObj(p,local_90[lVar38]);
              sVar6 = pIVar12->pCuts[lVar22].nSize;
              if ((*(uint *)&pIVar15->field_0x8 & 0xf) == 7) {
                lVar14 = (long)sVar6;
                break;
              }
            }
            if (lVar14 == lVar38) {
              p_01->nCutsGood = p_01->nCutsGood + 1;
              aVar13 = Abc_Clock();
              iVar23 = (int)pIVar12->pCuts[lVar22].nSize;
              if (5 < iVar23) {
                __assert_fail("nNums < 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                              ,0x15a,"unsigned int Ivy_NodeGetTruth(Ivy_Obj_t *, int *, int)");
              }
              uVar7 = Ivy_NodeGetTruth_rec(pNode,piVar37,iVar23);
              uVar7 = uVar7 & 0xffff;
              aVar16 = Abc_Clock();
              p_01->timeTruth = p_01->timeTruth + (aVar16 - aVar13);
              pcVar2 = p_01->pPerms4[p_01->pPerms[uVar7]];
              cVar1 = p_01->pPhases[uVar7];
              pVVar31 = p_01->vFaninsCur;
              pVVar31->nSize = 0;
              sVar6 = pIVar12->pCuts[lVar22].nSize;
              uVar27 = (uint)sVar6;
              Vec_PtrGrow(pVVar31,uVar27);
              uVar17 = 0;
              if (0 < sVar6) {
                uVar17 = (ulong)uVar27;
              }
              for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
                pVVar31->pArray[uVar21] = (void *)0x0;
              }
              pVVar31->nSize = uVar27;
              for (lVar38 = 0; lVar38 < pIVar12->pCuts[lVar22].nSize; lVar38 = lVar38 + 1) {
                pIVar15 = Ivy_ManObj(p,piVar37[pcVar2[lVar38]]);
                uVar27 = *(uint *)&pIVar15->field_0x8 & 0xf;
                if (((uVar27 - 7 < 0xfffffffe) && (uVar27 != 1)) && (uVar27 != 4)) {
                  __assert_fail("Ivy_ObjIsNode(pFanin) || Ivy_ObjIsCi(pFanin)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                ,0xcf,
                                "int Ivy_NodeRewrite(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, int, int)"
                               );
                }
                if (p_01->vFaninsCur->nSize <= lVar38) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                p_01->vFaninsCur->pArray[lVar38] =
                     (void *)((ulong)pIVar15 ^
                             (ulong)(((uint)(int)cVar1 >> ((uint)lVar38 & 0x1f) & 1) != 0));
              }
              aVar13 = Abc_Clock();
              for (iVar23 = 0; iVar23 < p_01->vFaninsCur->nSize; iVar23 = iVar23 + 1) {
                pvVar18 = Vec_PtrEntry(p_01->vFaninsCur,iVar23);
                piVar37 = (int *)(((ulong)pvVar18 & 0xfffffffffffffffe) + 0xc);
                *piVar37 = *piVar37 + 1;
              }
              Ivy_ManIncrementTravId(p);
              iVar23 = Ivy_ObjMffcLabel(p,pNode);
              for (iVar28 = 0; iVar28 < p_01->vFaninsCur->nSize; iVar28 = iVar28 + 1) {
                pvVar18 = Vec_PtrEntry(p_01->vFaninsCur,iVar28);
                Ivy_ObjRefsDec((Ivy_Obj_t *)((ulong)pvVar18 & 0xfffffffffffffffe));
              }
              aVar16 = Abc_Clock();
              p_01->timeMffc = p_01->timeMffc + (aVar16 - aVar13);
              aVar13 = Abc_Clock();
              if (p_01->vClasses->nSize <= (int)(uint)p_01->pMap[uVar7]) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                              ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
              }
              pVVar31 = p_01->vFaninsCur;
              p_00 = (Vec_Ptr_t *)p_01->vClasses->pArray[p_01->pMap[uVar7]];
              iVar28 = p_00->nSize;
              p_01->nSubgraphs = p_01->nSubgraphs + iVar28;
              piVar37 = (int *)0x0;
              local_f4 = -1;
              for (iVar29 = 0; iVar29 < iVar28; iVar29 = iVar29 + 1) {
                pvVar18 = Vec_PtrEntry(p_00,iVar29);
                piVar3 = *(int **)((long)pvVar18 + 0x20);
                lVar38 = 8;
                for (lVar14 = 0; lVar14 < pVVar31->nSize; lVar14 = lVar14 + 1) {
                  pvVar18 = Vec_PtrEntry(pVVar31,(int)lVar14);
                  *(void **)(*(long *)(piVar3 + 4) + lVar38) = pvVar18;
                  lVar38 = lVar38 + 0x18;
                }
                iVar28 = 0;
                if ((*piVar3 == 0) &&
                   (uVar27 = piVar3[1], iVar28 = 0, uVar27 <= ((uint)piVar3[6] >> 1 & 0x3fffffff)))
                {
                  lVar38 = 0x10;
                  for (lVar14 = 0; lVar36 = (long)(int)uVar27, lVar14 < lVar36; lVar14 = lVar14 + 1)
                  {
                    lVar36 = *(long *)(piVar3 + 4);
                    *(uint *)(lVar36 + lVar38) =
                         *(uint *)(lVar36 + lVar38) & 0xffffc000 |
                         *(uint *)((*(ulong *)(lVar36 + -8 + lVar38) & 0xfffffffffffffffe) + 8) >>
                         0xb & 0x3fff;
                    uVar27 = piVar3[1];
                    lVar38 = lVar38 + 0x18;
                  }
                  lVar38 = lVar36 * 0x18 + 0x10;
                  iVar28 = 0;
                  for (; lVar36 < piVar3[2]; lVar36 = lVar36 + 1) {
                    lVar14 = *(long *)(piVar3 + 4);
                    uVar27 = *(uint *)(lVar14 + -0x10 + lVar38);
                    uVar24 = *(uint *)(lVar14 + -0xc + lVar38);
                    lVar32 = (ulong)(uVar27 >> 1 & 0x3fffffff) * 0x18;
                    lVar25 = (ulong)(uVar24 >> 1 & 0x3fffffff) * 0x18;
                    pIVar15 = *(Ivy_Obj_t **)(lVar14 + 8 + lVar32);
                    pIVar35 = *(Ivy_Obj_t **)(lVar14 + 8 + lVar25);
                    if ((pIVar15 == (Ivy_Obj_t *)0x0) || (pIVar35 == (Ivy_Obj_t *)0x0)) {
                      pIVar20 = (Ivy_Obj_t *)0x0;
                      bVar5 = true;
LAB_0064c1fc:
                      bVar4 = bVar5;
                      if (iVar23 <= iVar28) goto LAB_0064bff3;
                      iVar28 = iVar28 + 1;
                      pIVar30 = pIVar35;
                      pIVar26 = pIVar15;
                    }
                    else {
                      piVar34 = (int *)((ulong)pIVar15 & 0xfffffffffffffffe);
                      if (*piVar34 == 0) {
                        __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                      ,0x137,
                                      "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                     );
                      }
                      pIVar20 = (Ivy_Obj_t *)(ulong)(uVar24 & 1);
                      piVar33 = (int *)0x0;
                      if ((pIVar20 != pIVar35) &&
                         (piVar33 = (int *)((ulong)pIVar35 & 0xfffffffffffffffe), *piVar33 == 0)) {
                        __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                      ,0x138,
                                      "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                     );
                      }
                      if (piVar34 == piVar33) {
                        __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                      ,0x139,
                                      "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                     );
                      }
                      pIVar19 = (Ivy_Obj_t *)(ulong)(uVar27 & 1);
                      pIVar26 = (Ivy_Obj_t *)((ulong)pIVar15 ^ (ulong)pIVar19);
                      pIVar30 = (Ivy_Obj_t *)((ulong)pIVar35 ^ (ulong)pIVar20);
                      *(uint *)&(p->Ghost).field_0x8 =
                           *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
                      (p->Ghost).pFanin0 = pIVar26;
                      (p->Ghost).pFanin1 = pIVar30;
                      if (pIVar20 != pIVar35) {
                        iVar8 = 0;
                        if (pIVar19 != pIVar15) {
                          iVar8 = *piVar34;
                        }
                        if (*piVar33 < iVar8) {
                          (p->Ghost).pFanin0 = pIVar30;
                          (p->Ghost).pFanin1 = pIVar26;
                        }
                      }
                      pIVar20 = Ivy_TableLookup(p,&p->Ghost);
                      if (pNode == (Ivy_Obj_t *)((ulong)pIVar20 & 0xfffffffffffffffe))
                      goto LAB_0064bff3;
                      pIVar35 = pIVar30;
                      pIVar15 = pIVar26;
                      if (pIVar20 == (Ivy_Obj_t *)0x0) {
                        pIVar20 = (Ivy_Obj_t *)0x0;
                        bVar5 = true;
                        goto LAB_0064c1fc;
                      }
                      bVar4 = false;
                      bVar5 = false;
                      if (((Ivy_Obj_t *)((ulong)pIVar20 & 0xfffffffffffffffe))->TravId ==
                          p->nTravIds) goto LAB_0064c1fc;
                    }
                    uVar24 = *(uint *)(lVar32 + lVar14 + 0x10) & 0x3fff;
                    uVar27 = *(uint *)(lVar25 + lVar14 + 0x10) & 0x3fff;
                    if (uVar27 < uVar24) {
                      uVar27 = uVar24;
                    }
                    uVar27 = uVar27 + 1;
                    if (!bVar4) {
                      pIVar15 = (Ivy_Obj_t *)((ulong)pIVar20 & 0xfffffffffffffffe);
                      if (p->pConst1 == pIVar15) {
                        uVar27 = 0;
                      }
                      else if ((pIVar15 == (Ivy_Obj_t *)((ulong)pIVar26 & 0xfffffffffffffffe)) ||
                              (pIVar15 == (Ivy_Obj_t *)((ulong)pIVar30 & 0xfffffffffffffffe))) {
                        uVar27 = *(uint *)&pIVar15->field_0x8 >> 0xb;
                      }
                    }
                    if (local_cc < (int)uVar27) goto LAB_0064bff3;
                    *(Ivy_Obj_t **)(lVar14 + -8 + lVar38) = pIVar20;
                    *(uint *)(lVar14 + lVar38) =
                         *(uint *)(lVar14 + lVar38) & 0xffffc000 | uVar27 & 0x3fff;
                    lVar38 = lVar38 + 0x18;
                  }
                  if (iVar28 != -1) goto LAB_0064bfd6;
                }
                else {
LAB_0064bfd6:
                  iVar8 = iVar23 - iVar28;
                  if (iVar23 < iVar28) {
                    __assert_fail("nNodesSaved >= nNodesAdded",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                  ,0x180,
                                  "Dec_Graph_t *Rwt_CutEvaluate(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, int, int, int *, unsigned int)"
                                 );
                  }
                  if (local_f4 < iVar8) {
                    piVar37 = piVar3;
                  }
                  if (local_f4 <= iVar8) {
                    local_f4 = iVar8;
                  }
                }
LAB_0064bff3:
                iVar28 = p_00->nSize;
              }
              if (local_f4 == -1) {
                piVar37 = (int *)0x0;
                local_f4 = local_f8;
              }
              aVar16 = Abc_Clock();
              p_01->timeEval = p_01->timeEval + (aVar16 - aVar13);
              local_f8 = local_f4;
              if ((piVar37 != (int *)0x0) && (local_108 < local_f4)) {
                p_01->pGraph = piVar37;
                p_01->fCompl = (uint)(int)cVar1 >> 4 & 1;
                p_01->vFanins->nSize = 0;
                for (iVar23 = 0; local_108 = local_f4, local_d8 = uVar7,
                    iVar23 < p_01->vFaninsCur->nSize; iVar23 = iVar23 + 1) {
                  pvVar18 = Vec_PtrEntry(p_01->vFaninsCur,iVar23);
                  pVVar31 = p_01->vFanins;
                  iVar28 = pVVar31->nSize;
                  if (iVar28 == pVVar31->nCap) {
                    iVar29 = iVar28 * 2;
                    if (iVar28 < 0x10) {
                      iVar29 = 0x10;
                    }
                    Vec_PtrGrow(pVVar31,iVar29);
                    iVar28 = pVVar31->nSize;
                  }
                  pVVar31->nSize = iVar28 + 1;
                  pVVar31->pArray[iVar28] = pvVar18;
                }
              }
            }
            else {
              p_01->nCutsBad = p_01->nCutsBad + 1;
            }
          }
          local_90 = local_90 + 9;
        }
        aVar13 = Abc_Clock();
        p_01->timeRes = p_01->timeRes + (aVar13 - aVar11);
        if (local_108 != -1) {
          lVar22 = 8;
          for (lVar38 = 0; lVar38 < p_01->vFanins->nSize; lVar38 = lVar38 + 1) {
            pvVar18 = Vec_PtrEntry(p_01->vFanins,(int)lVar38);
            *(void **)(*(long *)((long)p_01->pGraph + 0x10) + lVar22) = pvVar18;
            lVar22 = lVar22 + 0x18;
          }
          p_01->nScores[p_01->pMap[local_d8]] = p_01->nScores[p_01->pMap[local_d8]] + 1;
          p_01->nNodesGained = p_01->nNodesGained + local_108;
          if ((fUseZeroCost != 0) || (0 < local_108)) {
            p_01->nNodesRewritten = p_01->nNodesRewritten + 1;
            if ((0 < local_108) || (fUseZeroCost != 0 && local_108 == 0)) {
              pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(p_01);
              iVar23 = Rwt_ManReadCompl(p_01);
              aVar11 = Abc_Clock();
              if (iVar23 == 0) {
                Ivy_GraphUpdateNetwork(p,pNode,pGraph,fUpdateLevel,local_108);
              }
              else {
                *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
                Ivy_GraphUpdateNetwork(p,pNode,pGraph,fUpdateLevel,local_108);
                *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
              }
              aVar13 = Abc_Clock();
              Rwt_ManAddTimeUpdate(p_01,aVar13 - aVar11);
            }
          }
        }
      }
      pVVar31 = p->vObjs;
      iVar23 = pVVar31->nSize;
    }
    aVar11 = Abc_Clock();
    Rwt_ManAddTimeTotal(p_01,aVar11 - aVar10);
    if (fVerbose != 0) {
      Rwt_ManPrintStats(p_01);
    }
    Rwt_ManStop(p_01);
    p->pData = (void *)0x0;
    if (fUpdateLevel == 0) {
      Ivy_ManResetLevels(p);
    }
    else {
      __ptr = p->vRequired;
      free(__ptr->pArray);
      free(__ptr);
      p->vRequired = (Vec_Int_t *)0x0;
    }
    uVar7 = Ivy_ManCleanup(p);
    if (uVar7 != 0) {
      printf("Cleanup after rewriting removed %d dangling nodes.\n",(ulong)uVar7);
    }
    iVar9 = Ivy_ManCheck(p);
    if (iVar9 == 0) {
      puts("Ivy_ManRewritePre(): The check has failed.");
    }
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Ivy_ManRewritePre( Ivy_Man_t * p, int fUpdateLevel, int fUseZeroCost, int fVerbose )
{
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( fUpdateLevel && p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Ivy_ManRequiredLevels( p );
    // set the number of levels
//    p->nLevelMax = Ivy_ManLevels( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        // fix the fanin buffer problem
        Ivy_NodeFixBufferFanins( p, pNode, 1 );
        if ( Ivy_ObjIsBuf(pNode) )
            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes )
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewrite( p, pManRwt, pNode, fUpdateLevel, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
/*
            {
                Ivy_Obj_t * pObj;
                int i;
                printf( "USING: (" );
                Vec_PtrForEachEntry( Ivy_Obj_t *, Rwt_ManReadLeaves(pManRwt), pObj, i )
                    printf( "%d ", Ivy_ObjFanoutNum(Ivy_Regular(pObj)) );
                printf( ")   Gain = %d.\n", nGain );
            }
            if ( nGain > 0 )
            { // print stats on the MFFC
                extern void Ivy_NodeMffcConeSuppPrint( Ivy_Obj_t * pNode );
                printf( "Node %6d : Gain = %4d  ", pNode->Id, nGain );
                Ivy_NodeMffcConeSuppPrint( pNode );
            }
*/
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetwork( p, pNode, pGraph, fUpdateLevel, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    if ( fUpdateLevel )
        Vec_IntFree( p->vRequired ), p->vRequired = NULL;
    else
        Ivy_ManResetLevels( p );
    // check
    if ( (i = Ivy_ManCleanup(p)) )
        printf( "Cleanup after rewriting removed %d dangling nodes.\n", i );
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}